

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcConversionBasedUnit::~IfcConversionBasedUnit
          (IfcConversionBasedUnit *this)

{
  undefined1 *puVar1;
  LazyObject *pLVar2;
  
  *(undefined ***)&this[-1].field_0x50 = &PTR__IfcConversionBasedUnit_00996d00;
  *(undefined ***)&(this->super_IfcNamedUnit).field_0x38 = &PTR__IfcConversionBasedUnit_00996d50;
  (this->super_IfcNamedUnit).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.
  _vptr_ObjectHelper = (_func_int **)&PTR__IfcConversionBasedUnit_00996d28;
  puVar1 = *(undefined1 **)
            &(this->super_IfcNamedUnit).
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.field_0x10;
  if (puVar1 != &(this->super_IfcNamedUnit).
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>.field_0x20) {
    operator_delete(puVar1);
  }
  *(undefined8 *)&this[-1].field_0x50 = 0x996d78;
  *(undefined8 *)&(this->super_IfcNamedUnit).field_0x38 = 0x996da0;
  pLVar2 = this[-1].ConversionFactor.obj;
  if (pLVar2 != (LazyObject *)&this[-1].field_0x78) {
    operator_delete(pLVar2);
  }
  operator_delete(&this[-1].field_0x50);
  return;
}

Assistant:

IfcConversionBasedUnit() : Object("IfcConversionBasedUnit") {}